

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall polyscope::SlicePlane::draw(SlicePlane *this)

{
  undefined8 uVar1;
  element_type *peVar2;
  mat4 projMat;
  mat4 viewMat;
  allocator local_151;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  allocator local_90 [64];
  undefined1 local_50 [64];
  
  if ((this->drawPlane).value == true) {
    view::getCameraViewMatrix();
    peVar2 = (this->planeProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_b0,"u_viewMatrix",local_90);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_b0,local_50);
    std::__cxx11::string::~string(local_b0);
    view::getCameraPerspectiveMatrix();
    peVar2 = (this->planeProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_d0,"u_projMatrix",&local_151);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_d0,local_90);
    std::__cxx11::string::~string(local_d0);
    peVar2 = (this->planeProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_f0,"u_objectMatrix",&local_151);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_f0,&(this->objectTransform).value);
    std::__cxx11::string::~string(local_f0);
    peVar2 = (this->planeProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_110,"u_lengthScale",&local_151);
    (*peVar2->_vptr_ShaderProgram[6])(state::lengthScale,peVar2,local_110);
    std::__cxx11::string::~string(local_110);
    peVar2 = (this->planeProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_130,"u_color",&local_151);
    uVar1._0_4_ = (this->color).value.field_0;
    uVar1._4_4_ = (this->color).value.field_1;
    (*peVar2->_vptr_ShaderProgram[9])
              (uVar1,(ulong)(uint)(this->color).value.field_2,peVar2,local_130);
    std::__cxx11::string::~string(local_130);
    peVar2 = (this->planeProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_150,"u_transparency",&local_151);
    (*peVar2->_vptr_ShaderProgram[5])((ulong)(uint)(this->transparency).value,peVar2,local_150);
    std::__cxx11::string::~string(local_150);
    (**(code **)(*render::engine + 0x50))(render::engine,0);
    (**(code **)(*render::engine + 0x68))(render::engine,0);
    (**(code **)(*render::engine + 0x120))();
    (*((this->planeProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
  }
  return;
}

Assistant:

void SlicePlane::draw() {
  if (!drawPlane.get()) return;

  // Set uniforms
  glm::mat4 viewMat = view::getCameraViewMatrix();
  planeProgram->setUniform("u_viewMatrix", glm::value_ptr(viewMat));
  glm::mat4 projMat = view::getCameraPerspectiveMatrix();
  planeProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));

  planeProgram->setUniform("u_objectMatrix", glm::value_ptr(objectTransform.get()));
  planeProgram->setUniform("u_lengthScale", state::lengthScale);
  planeProgram->setUniform("u_color", color.get());
  planeProgram->setUniform("u_transparency", transparency.get());

  // glm::vec3 center{objectTransform.get()[3][0], objectTransform.get()[3][1], objectTransform.get()[3][2]};
  // planeProgram->setUniform("u_center", center);

  render::engine->setDepthMode(DepthMode::Less);
  render::engine->setBackfaceCull(false);
  render::engine->applyTransparencySettings();
  planeProgram->draw();
}